

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphSolve(Nwk_Grf_t *p)

{
  Nwk_Vrt_t *pNVar1;
  Nwk_Vrt_t *pNext_00;
  int local_28;
  int local_24;
  int j;
  int i;
  Nwk_Vrt_t *pNext;
  Nwk_Vrt_t *pVertex;
  Nwk_Grf_t *p_local;
  
  Nwk_ManGraphPrepare(p);
  do {
    do {
      if (p->pLists1[0] != 0) {
        __assert_fail("p->pLists1[0] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/nwk/nwkMerge.c"
                      ,0x275,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
      }
      for (local_24 = 1; local_24 < 0x11; local_24 = local_24 + 1) {
        if (p->pLists1[local_24] != 0) {
          pNVar1 = p->pVerts[p->pLists1[local_24]];
          if (pNVar1->nEdges != 1) {
            __assert_fail("pVertex->nEdges == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/nwk/nwkMerge.c"
                          ,0x27c,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
          }
          Nwk_ManGraphUpdate(p,pNVar1,p->pVerts[pNVar1[1].Id]);
          break;
        }
      }
    } while (local_24 < 0x11);
    if (p->pLists2[0] != 0) {
      __assert_fail("p->pLists2[0] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/nwk/nwkMerge.c"
                    ,0x284,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    if (p->pLists2[1] != 0) {
      __assert_fail("p->pLists2[1] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/nwk/nwkMerge.c"
                    ,0x285,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
    }
    for (local_28 = 2; local_28 < 0x11; local_28 = local_28 + 1) {
      if (p->pLists2[local_28] != 0) {
        pNVar1 = Nwk_ManGraphListFindMin(p,p->pLists2[local_28]);
        if ((pNVar1->nEdges != local_28) && (local_28 != 0x10)) {
          __assert_fail("pVertex->nEdges == j || j == NWK_MAX_LIST",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/nwk/nwkMerge.c"
                        ,0x28c,"void Nwk_ManGraphSolve(Nwk_Grf_t *)");
        }
        pNext_00 = Nwk_ManGraphListFindMinEdge(p,pNVar1);
        Nwk_ManGraphUpdate(p,pNVar1,pNext_00);
        break;
      }
    }
    if (local_28 == 0x11) {
      Nwk_ManGraphSortPairs(p);
      return;
    }
  } while( true );
}

Assistant:

void Nwk_ManGraphSolve( Nwk_Grf_t * p )
{
    Nwk_Vrt_t * pVertex, * pNext;
    int i, j;
    Nwk_ManGraphPrepare( p );
    while ( 1 )
    {
        // find the next vertex to extract
        assert( p->pLists1[0] == 0 );
        for ( i = 1; i <= NWK_MAX_LIST; i++ )
            if ( p->pLists1[i] )
            {
//                printf( "%d ", i );
//                printf( "ListA = %2d. Length = %5d.\n", i, Nwk_ManGraphListLength(p,p->pLists1[i]) );
                pVertex = p->pVerts[ p->pLists1[i] ];
                assert( pVertex->nEdges == 1 );
                pNext = p->pVerts[ pVertex->pEdges[0] ];
                Nwk_ManGraphUpdate( p, pVertex, pNext );
                break;
            }
        if ( i < NWK_MAX_LIST + 1 )
            continue;
        // find the next vertex to extract
        assert( p->pLists2[0] == 0 );
        assert( p->pLists2[1] == 0 );
        for ( j = 2; j <= NWK_MAX_LIST; j++ )
            if ( p->pLists2[j] )
            {
//                printf( "***%d ", j );
//                printf( "ListB = %2d. Length = %5d.\n", j, Nwk_ManGraphListLength(p,p->pLists2[j]) );
                pVertex = Nwk_ManGraphListFindMin( p, p->pLists2[j] ); 
                assert( pVertex->nEdges == j || j == NWK_MAX_LIST );
                pNext = Nwk_ManGraphListFindMinEdge( p, pVertex );
                Nwk_ManGraphUpdate( p, pVertex, pNext );
                break;
            }
        if ( j == NWK_MAX_LIST + 1 )
            break;
    }
    Nwk_ManGraphSortPairs( p );
}